

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

lostFraction __thiscall
llvm::detail::IEEEFloat::addOrSubtractSignificand(IEEEFloat *this,IEEEFloat *rhs,bool subtract)

{
  bool bVar1;
  cmpResult cVar2;
  undefined1 local_68 [8];
  IEEEFloat temp_rhs_1;
  undefined1 local_48 [7];
  bool reverse;
  IEEEFloat temp_rhs;
  int bits;
  lostFraction lost_fraction;
  integerPart carry;
  bool subtract_local;
  IEEEFloat *rhs_local;
  IEEEFloat *this_local;
  
  temp_rhs._16_4_ = (int)this->exponent - (int)rhs->exponent;
  if (subtract == (((byte)this->field_0x12 >> 3 & 1) != ((byte)rhs->field_0x12 >> 3 & 1))) {
    if ((int)temp_rhs._16_4_ < 1) {
      temp_rhs._20_4_ = shiftSignificandRight(this,-temp_rhs._16_4_);
      _bits = addSignificand(this,rhs);
    }
    else {
      IEEEFloat((IEEEFloat *)local_68,rhs);
      temp_rhs._20_4_ = shiftSignificandRight((IEEEFloat *)local_68,temp_rhs._16_4_);
      _bits = addSignificand(this,(IEEEFloat *)local_68);
      ~IEEEFloat((IEEEFloat *)local_68);
    }
    if (_bits != 0) {
      __assert_fail("!carry",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x5db,
                    "lostFraction llvm::detail::IEEEFloat::addOrSubtractSignificand(const IEEEFloat &, bool)"
                   );
    }
  }
  else {
    IEEEFloat((IEEEFloat *)local_48,rhs);
    if (temp_rhs._16_4_ == 0) {
      cVar2 = compareAbsoluteValue(this,(IEEEFloat *)local_48);
      temp_rhs._20_4_ = 0;
      temp_rhs_1._23_1_ = cVar2 == cmpLessThan;
    }
    else {
      bVar1 = (int)temp_rhs._16_4_ < 1;
      temp_rhs_1._23_1_ = bVar1;
      if (bVar1) {
        temp_rhs._20_4_ = shiftSignificandRight(this,0xffffffff - temp_rhs._16_4_);
        shiftSignificandLeft((IEEEFloat *)local_48,1);
      }
      else {
        temp_rhs._20_4_ = shiftSignificandRight((IEEEFloat *)local_48,temp_rhs._16_4_ - 1);
        shiftSignificandLeft(this,1);
      }
    }
    if (temp_rhs_1._23_1_ == '\0') {
      _bits = subtractSignificand(this,(IEEEFloat *)local_48,(ulong)(temp_rhs._20_4_ != 0));
    }
    else {
      _bits = subtractSignificand((IEEEFloat *)local_48,this,(ulong)(temp_rhs._20_4_ != 0));
      copySignificand(this,(IEEEFloat *)local_48);
      this->field_0x12 = this->field_0x12 & 0xf7 | (((byte)this->field_0x12 >> 3 & 1) == 0) << 3;
    }
    if (temp_rhs._20_4_ == 1) {
      temp_rhs._20_4_ = 3;
    }
    else if (temp_rhs._20_4_ == 3) {
      temp_rhs._20_4_ = 1;
    }
    if (_bits != 0) {
      __assert_fail("!carry",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x5cd,
                    "lostFraction llvm::detail::IEEEFloat::addOrSubtractSignificand(const IEEEFloat &, bool)"
                   );
    }
    ~IEEEFloat((IEEEFloat *)local_48);
  }
  return temp_rhs._20_4_;
}

Assistant:

lostFraction IEEEFloat::addOrSubtractSignificand(const IEEEFloat &rhs,
                                                 bool subtract) {
  integerPart carry;
  lostFraction lost_fraction;
  int bits;

  /* Determine if the operation on the absolute values is effectively
     an addition or subtraction.  */
  subtract ^= static_cast<bool>(sign ^ rhs.sign);

  /* Are we bigger exponent-wise than the RHS?  */
  bits = exponent - rhs.exponent;

  /* Subtraction is more subtle than one might naively expect.  */
  if (subtract) {
    IEEEFloat temp_rhs(rhs);
    bool reverse;

    if (bits == 0) {
      reverse = compareAbsoluteValue(temp_rhs) == cmpLessThan;
      lost_fraction = lfExactlyZero;
    } else if (bits > 0) {
      lost_fraction = temp_rhs.shiftSignificandRight(bits - 1);
      shiftSignificandLeft(1);
      reverse = false;
    } else {
      lost_fraction = shiftSignificandRight(-bits - 1);
      temp_rhs.shiftSignificandLeft(1);
      reverse = true;
    }

    if (reverse) {
      carry = temp_rhs.subtractSignificand
        (*this, lost_fraction != lfExactlyZero);
      copySignificand(temp_rhs);
      sign = !sign;
    } else {
      carry = subtractSignificand
        (temp_rhs, lost_fraction != lfExactlyZero);
    }

    /* Invert the lost fraction - it was on the RHS and
       subtracted.  */
    if (lost_fraction == lfLessThanHalf)
      lost_fraction = lfMoreThanHalf;
    else if (lost_fraction == lfMoreThanHalf)
      lost_fraction = lfLessThanHalf;

    /* The code above is intended to ensure that no borrow is
       necessary.  */
    assert(!carry);
    (void)carry;
  } else {
    if (bits > 0) {
      IEEEFloat temp_rhs(rhs);

      lost_fraction = temp_rhs.shiftSignificandRight(bits);
      carry = addSignificand(temp_rhs);
    } else {
      lost_fraction = shiftSignificandRight(-bits);
      carry = addSignificand(rhs);
    }

    /* We have a guard bit; generating a carry cannot happen.  */
    assert(!carry);
    (void)carry;
  }

  return lost_fraction;
}